

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

ENetPeer *
enet_protocol_handle_connect(ENetHost *host,ENetProtocolHeader *header,ENetProtocol *command)

{
  enet_uint8 eVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [11];
  undefined1 auVar5 [12];
  undefined1 auVar6 [13];
  undefined1 auVar7 [14];
  uint uVar8;
  uint16_t uVar9;
  uint32_t uVar10;
  void *pvVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  byte bVar27;
  ENetProtocolHeader local_a0;
  ENetProtocolHeader local_9c;
  undefined1 local_90 [8];
  ENetProtocol verifyCommand;
  ENetPeer *peer;
  ENetPeer *currentPeer;
  size_t duplicatePeers;
  size_t channelCount;
  ENetChannel *channel;
  uint local_30;
  enet_uint32 windowSize;
  enet_uint32 mtu;
  enet_uint8 outgoingSessionID;
  enet_uint8 incomingSessionID;
  ENetProtocol *command_local;
  ENetProtocolHeader *header_local;
  ENetHost *host_local;
  
  currentPeer = (ENetPeer *)0x0;
  verifyCommand._40_8_ = 0;
  _mtu = command;
  command_local = (ENetProtocol *)header;
  header_local = (ENetProtocolHeader *)host;
  uVar10 = ntohl((command->connect).channelCount);
  duplicatePeers = (size_t)uVar10;
  if ((duplicatePeers == 0) || (0xff < duplicatePeers)) {
    host_local = (ENetHost *)0x0;
  }
  else {
    for (peer = *(ENetPeer **)(header_local + 0xc);
        peer < (ENetPeer *)(*(long *)(header_local + 0xc) + *(long *)(header_local + 0xe) * 0x1f8);
        peer = peer + 1) {
      if (peer->state == ENET_PEER_STATE_DISCONNECTED) {
        if (verifyCommand._40_8_ == 0) {
          verifyCommand._40_8_ = peer;
        }
      }
      else if (peer->state != ENET_PEER_STATE_CONNECTING) {
        cVar12 = -((peer->address).host.__in6_u.__u6_addr8[0] == (uint8_t)header_local[0xab0].peerID
                  );
        cVar13 = -((peer->address).host.__in6_u.__u6_addr8[1] ==
                  *(uint8_t *)((long)&header_local[0xab0].peerID + 1));
        cVar14 = -((peer->address).host.__in6_u.__u6_addr8[2] ==
                  (uint8_t)header_local[0xab0].sentTime);
        cVar15 = -((peer->address).host.__in6_u.__u6_addr8[3] ==
                  *(uint8_t *)((long)&header_local[0xab0].sentTime + 1));
        cVar16 = -((peer->address).host.__in6_u.__u6_addr8[4] == (uint8_t)header_local[0xab1].peerID
                  );
        cVar17 = -((peer->address).host.__in6_u.__u6_addr8[5] ==
                  *(uint8_t *)((long)&header_local[0xab1].peerID + 1));
        cVar18 = -((peer->address).host.__in6_u.__u6_addr8[6] ==
                  (uint8_t)header_local[0xab1].sentTime);
        cVar19 = -((peer->address).host.__in6_u.__u6_addr8[7] ==
                  *(uint8_t *)((long)&header_local[0xab1].sentTime + 1));
        cVar20 = -((peer->address).host.__in6_u.__u6_addr8[8] == (uint8_t)header_local[0xab2].peerID
                  );
        cVar21 = -((peer->address).host.__in6_u.__u6_addr8[9] ==
                  *(uint8_t *)((long)&header_local[0xab2].peerID + 1));
        cVar22 = -((peer->address).host.__in6_u.__u6_addr8[10] ==
                  (uint8_t)header_local[0xab2].sentTime);
        cVar23 = -((peer->address).host.__in6_u.__u6_addr8[0xb] ==
                  *(uint8_t *)((long)&header_local[0xab2].sentTime + 1));
        cVar24 = -((peer->address).host.__in6_u.__u6_addr8[0xc] ==
                  (uint8_t)header_local[0xab3].peerID);
        cVar25 = -((peer->address).host.__in6_u.__u6_addr8[0xd] ==
                  *(uint8_t *)((long)&header_local[0xab3].peerID + 1));
        cVar26 = -((peer->address).host.__in6_u.__u6_addr8[0xe] ==
                  (uint8_t)header_local[0xab3].sentTime);
        bVar27 = -((peer->address).host.__in6_u.__u6_addr8[0xf] ==
                  *(uint8_t *)((long)&header_local[0xab3].sentTime + 1));
        auVar2[1] = cVar13;
        auVar2[0] = cVar12;
        auVar2[2] = cVar14;
        auVar2[3] = cVar15;
        auVar2[4] = cVar16;
        auVar2[5] = cVar17;
        auVar2[6] = cVar18;
        auVar2[7] = cVar19;
        auVar2[8] = cVar20;
        auVar2[9] = cVar21;
        auVar2[10] = cVar22;
        auVar2[0xb] = cVar23;
        auVar2[0xc] = cVar24;
        auVar2[0xd] = cVar25;
        auVar2[0xe] = cVar26;
        auVar2[0xf] = bVar27;
        auVar3[1] = cVar13;
        auVar3[0] = cVar12;
        auVar3[2] = cVar14;
        auVar3[3] = cVar15;
        auVar3[4] = cVar16;
        auVar3[5] = cVar17;
        auVar3[6] = cVar18;
        auVar3[7] = cVar19;
        auVar3[8] = cVar20;
        auVar3[9] = cVar21;
        auVar3[10] = cVar22;
        auVar3[0xb] = cVar23;
        auVar3[0xc] = cVar24;
        auVar3[0xd] = cVar25;
        auVar3[0xe] = cVar26;
        auVar3[0xf] = bVar27;
        auVar7[1] = cVar15;
        auVar7[0] = cVar14;
        auVar7[2] = cVar16;
        auVar7[3] = cVar17;
        auVar7[4] = cVar18;
        auVar7[5] = cVar19;
        auVar7[6] = cVar20;
        auVar7[7] = cVar21;
        auVar7[8] = cVar22;
        auVar7[9] = cVar23;
        auVar7[10] = cVar24;
        auVar7[0xb] = cVar25;
        auVar7[0xc] = cVar26;
        auVar7[0xd] = bVar27;
        auVar6[1] = cVar16;
        auVar6[0] = cVar15;
        auVar6[2] = cVar17;
        auVar6[3] = cVar18;
        auVar6[4] = cVar19;
        auVar6[5] = cVar20;
        auVar6[6] = cVar21;
        auVar6[7] = cVar22;
        auVar6[8] = cVar23;
        auVar6[9] = cVar24;
        auVar6[10] = cVar25;
        auVar6[0xb] = cVar26;
        auVar6[0xc] = bVar27;
        auVar5[1] = cVar17;
        auVar5[0] = cVar16;
        auVar5[2] = cVar18;
        auVar5[3] = cVar19;
        auVar5[4] = cVar20;
        auVar5[5] = cVar21;
        auVar5[6] = cVar22;
        auVar5[7] = cVar23;
        auVar5[8] = cVar24;
        auVar5[9] = cVar25;
        auVar5[10] = cVar26;
        auVar5[0xb] = bVar27;
        auVar4[1] = cVar18;
        auVar4[0] = cVar17;
        auVar4[2] = cVar19;
        auVar4[3] = cVar20;
        auVar4[4] = cVar21;
        auVar4[5] = cVar22;
        auVar4[6] = cVar23;
        auVar4[7] = cVar24;
        auVar4[8] = cVar25;
        auVar4[9] = cVar26;
        auVar4[10] = bVar27;
        if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar7 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar6 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar5 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar4 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar27,CONCAT18(cVar26,CONCAT17(cVar25,CONCAT16(cVar24
                                                  ,CONCAT15(cVar23,CONCAT14(cVar22,CONCAT13(cVar21,
                                                  CONCAT12(cVar20,CONCAT11(cVar19,cVar18))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar27,CONCAT17(cVar26,CONCAT16(cVar25,CONCAT15(cVar24
                                                  ,CONCAT14(cVar23,CONCAT13(cVar22,CONCAT12(cVar21,
                                                  CONCAT11(cVar20,cVar19)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar27 >> 7) << 0xf) == 0xffff) {
          if (((peer->address).port == header_local[0xab4].peerID) &&
             (peer->connectID == (_mtu->connect).connectID)) {
            return (ENetPeer *)0x0;
          }
          currentPeer = (ENetPeer *)((long)&(currentPeer->dispatchList).next + 1);
        }
      }
    }
    if ((verifyCommand._40_8_ == 0) || (*(ENetPeer **)(header_local + 0xac4) <= currentPeer)) {
      host_local = (ENetHost *)0x0;
    }
    else {
      if (*(ulong *)(header_local + 0x10) < duplicatePeers) {
        duplicatePeers = *(size_t *)(header_local + 0x10);
      }
      pvVar11 = enet_malloc(duplicatePeers * 0x50);
      *(void **)(verifyCommand._40_8_ + 0x48) = pvVar11;
      if (*(long *)(verifyCommand._40_8_ + 0x48) == 0) {
        host_local = (ENetHost *)0x0;
      }
      else {
        *(size_t *)(verifyCommand._40_8_ + 0x50) = duplicatePeers;
        *(undefined4 *)(verifyCommand._40_8_ + 0x40) = 2;
        *(enet_uint32 *)(verifyCommand._40_8_ + 0x1c) = (_mtu->connect).connectID;
        *(undefined8 *)(verifyCommand._40_8_ + 0x24) = *(undefined8 *)(header_local + 0xab0);
        *(undefined8 *)(verifyCommand._40_8_ + 0x2c) = *(undefined8 *)(header_local + 0xab2);
        *(ENetProtocolHeader *)(verifyCommand._40_8_ + 0x34) = header_local[0xab4];
        *(ENetProtocolHeader *)(verifyCommand._40_8_ + 0xfc) = header_local[9];
        uVar9 = ntohs((_mtu->acknowledge).receivedReliableSequenceNumber);
        *(uint16_t *)(verifyCommand._40_8_ + 0x18) = uVar9;
        uVar10 = ntohl((_mtu->connect).incomingBandwidth);
        *(uint32_t *)(verifyCommand._40_8_ + 0x58) = uVar10;
        uVar10 = ntohl((_mtu->connect).outgoingBandwidth);
        *(uint32_t *)(verifyCommand._40_8_ + 0x5c) = uVar10;
        uVar10 = ntohl((_mtu->connect).packetThrottleInterval);
        *(uint32_t *)(verifyCommand._40_8_ + 0xd0) = uVar10;
        uVar10 = ntohl((_mtu->connect).packetThrottleAcceleration);
        *(uint32_t *)(verifyCommand._40_8_ + 200) = uVar10;
        uVar10 = ntohl((_mtu->connect).packetThrottleDeceleration);
        *(uint32_t *)(verifyCommand._40_8_ + 0xcc) = uVar10;
        uVar10 = ntohl((_mtu->connect).data);
        *(uint32_t *)(verifyCommand._40_8_ + 0x1e8) = uVar10;
        if ((_mtu->connect).incomingSessionID == 0xff) {
          eVar1 = *(enet_uint8 *)(verifyCommand._40_8_ + 0x20);
        }
        else {
          eVar1 = (_mtu->connect).incomingSessionID;
        }
        windowSize._3_1_ = eVar1 + 1 & 3;
        if (windowSize._3_1_ == *(byte *)(verifyCommand._40_8_ + 0x20)) {
          windowSize._3_1_ = windowSize._3_1_ + 1 & 3;
        }
        *(byte *)(verifyCommand._40_8_ + 0x20) = windowSize._3_1_;
        if ((_mtu->connect).outgoingSessionID == 0xff) {
          eVar1 = *(enet_uint8 *)(verifyCommand._40_8_ + 0x21);
        }
        else {
          eVar1 = (_mtu->connect).outgoingSessionID;
        }
        windowSize._2_1_ = eVar1 + 1 & 3;
        if (windowSize._2_1_ == *(byte *)(verifyCommand._40_8_ + 0x21)) {
          windowSize._2_1_ = windowSize._2_1_ + 1 & 3;
        }
        *(byte *)(verifyCommand._40_8_ + 0x21) = windowSize._2_1_;
        for (channelCount = *(size_t *)(verifyCommand._40_8_ + 0x48);
            channelCount < *(long *)(verifyCommand._40_8_ + 0x48) + duplicatePeers * 0x50;
            channelCount = channelCount + 0x50) {
          *(undefined2 *)channelCount = 0;
          *(undefined2 *)(channelCount + 2) = 0;
          *(undefined2 *)(channelCount + 0x26) = 0;
          *(undefined2 *)(channelCount + 0x28) = 0;
          enet_list_clear((ENetList *)(channelCount + 0x30));
          enet_list_clear((ENetList *)(channelCount + 0x40));
          *(undefined2 *)(channelCount + 4) = 0;
          memset((void *)(channelCount + 6),0,0x20);
        }
        local_30 = ntohl((_mtu->connect).mtu);
        if (local_30 < 0x240) {
          local_30 = 0x240;
        }
        else if (0x1000 < local_30) {
          local_30 = 0x1000;
        }
        if (local_30 < *(uint *)(verifyCommand._40_8_ + 0xfc)) {
          *(uint *)(verifyCommand._40_8_ + 0xfc) = local_30;
        }
        if ((header_local[7] == (ENetProtocolHeader)0x0) &&
           (*(int *)(verifyCommand._40_8_ + 0x58) == 0)) {
          *(undefined4 *)(verifyCommand._40_8_ + 0x100) = 0x10000;
        }
        else if ((header_local[7] == (ENetProtocolHeader)0x0) ||
                (*(int *)(verifyCommand._40_8_ + 0x58) == 0)) {
          if ((uint)*(ENetProtocolHeader *)(verifyCommand._40_8_ + 0x58) < (uint)header_local[7]) {
            local_9c = header_local[7];
          }
          else {
            local_9c = *(ENetProtocolHeader *)(verifyCommand._40_8_ + 0x58);
          }
          *(uint *)(verifyCommand._40_8_ + 0x100) = ((uint)local_9c >> 0x10) << 0xc;
        }
        else {
          if ((uint)header_local[7] < (uint)*(ENetProtocolHeader *)(verifyCommand._40_8_ + 0x58)) {
            local_a0 = header_local[7];
          }
          else {
            local_a0 = *(ENetProtocolHeader *)(verifyCommand._40_8_ + 0x58);
          }
          *(uint *)(verifyCommand._40_8_ + 0x100) = ((uint)local_a0 >> 0x10) << 0xc;
        }
        if (*(uint *)(verifyCommand._40_8_ + 0x100) < 0x1000) {
          *(undefined4 *)(verifyCommand._40_8_ + 0x100) = 0x1000;
        }
        else if (0x10000 < *(uint *)(verifyCommand._40_8_ + 0x100)) {
          *(undefined4 *)(verifyCommand._40_8_ + 0x100) = 0x10000;
        }
        if (header_local[6] == (ENetProtocolHeader)0x0) {
          channel._4_4_ = 0x10000;
        }
        else {
          channel._4_4_ = ((uint)header_local[6] >> 0x10) << 0xc;
        }
        uVar8 = channel._4_4_;
        uVar10 = ntohl((_mtu->connect).windowSize);
        if (uVar10 < uVar8) {
          channel._4_4_ = ntohl((_mtu->connect).windowSize);
        }
        if (channel._4_4_ < 0x1000) {
          channel._4_4_ = 0x1000;
        }
        else if (0x10000 < channel._4_4_) {
          channel._4_4_ = 0x10000;
        }
        local_90[0] = 0x83;
        local_90[1] = 0xff;
        local_90._4_2_ = htons(*(uint16_t *)(verifyCommand._40_8_ + 0x1a));
        local_90[6] = windowSize._3_1_;
        local_90[7] = windowSize._2_1_;
        verifyCommand.header =
             (ENetProtocolCommandHeader)htonl(*(uint32_t *)(verifyCommand._40_8_ + 0xfc));
        verifyCommand.disconnect.data = htonl(channel._4_4_);
        verifyCommand.connect.mtu = htonl((uint32_t)duplicatePeers);
        verifyCommand.connect.windowSize = htonl((uint32_t)header_local[6]);
        verifyCommand.connect.channelCount = htonl((uint32_t)header_local[7]);
        verifyCommand.connect.incomingBandwidth = htonl(*(uint32_t *)(verifyCommand._40_8_ + 0xd0));
        verifyCommand.connect.outgoingBandwidth = htonl(*(uint32_t *)(verifyCommand._40_8_ + 200));
        verifyCommand.connect.packetThrottleInterval =
             htonl(*(uint32_t *)(verifyCommand._40_8_ + 0xcc));
        verifyCommand.connect.packetThrottleAcceleration =
             *(enet_uint32 *)(verifyCommand._40_8_ + 0x1c);
        enet_peer_queue_outgoing_command
                  ((ENetPeer *)verifyCommand._40_8_,(ENetProtocol *)local_90,(ENetPacket *)0x0,0,0);
        host_local = (ENetHost *)verifyCommand._40_8_;
      }
    }
  }
  return (ENetPeer *)host_local;
}

Assistant:

static ENetPeer * enet_protocol_handle_connect(ENetHost *host, ENetProtocolHeader *header, ENetProtocol *command) {
        ENET_UNUSED(header)

        enet_uint8 incomingSessionID, outgoingSessionID;
        enet_uint32 mtu, windowSize;
        ENetChannel *channel;
        size_t channelCount, duplicatePeers = 0;
        ENetPeer *currentPeer, *peer = NULL;
        ENetProtocol verifyCommand;

        channelCount = ENET_NET_TO_HOST_32(command->connect.channelCount);

        if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT || channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT) {
            return NULL;
        }

        for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
            if (currentPeer->state == ENET_PEER_STATE_DISCONNECTED) {
                if (peer == NULL) {
                    peer = currentPeer;
                }
            } else if (currentPeer->state != ENET_PEER_STATE_CONNECTING && in6_equal(currentPeer->address.host, host->receivedAddress.host)) {
                if (currentPeer->address.port == host->receivedAddress.port && currentPeer->connectID == command->connect.connectID) {
                    return NULL;
                }

                ++duplicatePeers;
            }
        }

        if (peer == NULL || duplicatePeers >= host->duplicatePeers) {
            return NULL;
        }

        if (channelCount > host->channelLimit) {
            channelCount = host->channelLimit;
        }
        peer->channels = (ENetChannel *) enet_malloc(channelCount * sizeof(ENetChannel));
        if (peer->channels == NULL) {
            return NULL;
        }
        peer->channelCount               = channelCount;
        peer->state                      = ENET_PEER_STATE_ACKNOWLEDGING_CONNECT;
        peer->connectID                  = command->connect.connectID;
        peer->address                    = host->receivedAddress;
        peer->mtu                        = host->mtu;
        peer->outgoingPeerID             = ENET_NET_TO_HOST_16(command->connect.outgoingPeerID);
        peer->incomingBandwidth          = ENET_NET_TO_HOST_32(command->connect.incomingBandwidth);
        peer->outgoingBandwidth          = ENET_NET_TO_HOST_32(command->connect.outgoingBandwidth);
        peer->packetThrottleInterval     = ENET_NET_TO_HOST_32(command->connect.packetThrottleInterval);
        peer->packetThrottleAcceleration = ENET_NET_TO_HOST_32(command->connect.packetThrottleAcceleration);
        peer->packetThrottleDeceleration = ENET_NET_TO_HOST_32(command->connect.packetThrottleDeceleration);
        peer->eventData                  = ENET_NET_TO_HOST_32(command->connect.data);

        incomingSessionID = command->connect.incomingSessionID == 0xFF ? peer->outgoingSessionID : command->connect.incomingSessionID;
        incomingSessionID = (incomingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
        if (incomingSessionID == peer->outgoingSessionID) {
            incomingSessionID = (incomingSessionID + 1)
              & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
        }
        peer->outgoingSessionID = incomingSessionID;

        outgoingSessionID = command->connect.outgoingSessionID == 0xFF ? peer->incomingSessionID : command->connect.outgoingSessionID;
        outgoingSessionID = (outgoingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
        if (outgoingSessionID == peer->incomingSessionID) {
            outgoingSessionID = (outgoingSessionID + 1)
              & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
        }
        peer->incomingSessionID = outgoingSessionID;

        for (channel = peer->channels; channel < &peer->channels[channelCount]; ++channel) {
            channel->outgoingReliableSequenceNumber   = 0;
            channel->outgoingUnreliableSequenceNumber = 0;
            channel->incomingReliableSequenceNumber   = 0;
            channel->incomingUnreliableSequenceNumber = 0;

            enet_list_clear(&channel->incomingReliableCommands);
            enet_list_clear(&channel->incomingUnreliableCommands);

            channel->usedReliableWindows = 0;
            memset(channel->reliableWindows, 0, sizeof(channel->reliableWindows));
        }

        mtu = ENET_NET_TO_HOST_32(command->connect.mtu);

        if (mtu < ENET_PROTOCOL_MINIMUM_MTU) {
            mtu = ENET_PROTOCOL_MINIMUM_MTU;
        } else if (mtu > ENET_PROTOCOL_MAXIMUM_MTU) {
            mtu = ENET_PROTOCOL_MAXIMUM_MTU;
        }

        if (mtu < peer->mtu)
            peer->mtu = mtu;

        if (host->outgoingBandwidth == 0 && peer->incomingBandwidth == 0) {
            peer->windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
        } else if (host->outgoingBandwidth == 0 || peer->incomingBandwidth == 0) {
            peer->windowSize = (ENET_MAX(host->outgoingBandwidth, peer->incomingBandwidth) / ENET_PEER_WINDOW_SIZE_SCALE) * ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
        } else {
            peer->windowSize = (ENET_MIN(host->outgoingBandwidth, peer->incomingBandwidth) / ENET_PEER_WINDOW_SIZE_SCALE) * ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
        }

        if (peer->windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE) {
            peer->windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
        } else if (peer->windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE) {
            peer->windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
        }

        if (host->incomingBandwidth == 0) {
            windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
        } else {
            windowSize = (host->incomingBandwidth / ENET_PEER_WINDOW_SIZE_SCALE) * ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
        }

        if (windowSize > ENET_NET_TO_HOST_32(command->connect.windowSize)) {
            windowSize = ENET_NET_TO_HOST_32(command->connect.windowSize);
        }

        if (windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE) {
            windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
        } else if (windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE) {
            windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
        }

        verifyCommand.header.command                            = (int)ENET_PROTOCOL_COMMAND_VERIFY_CONNECT | (int)ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
        verifyCommand.header.channelID                          = 0xFF;
        verifyCommand.verifyConnect.outgoingPeerID              = ENET_HOST_TO_NET_16(peer->incomingPeerID);
        verifyCommand.verifyConnect.incomingSessionID           = incomingSessionID;
        verifyCommand.verifyConnect.outgoingSessionID           = outgoingSessionID;
        verifyCommand.verifyConnect.mtu                         = ENET_HOST_TO_NET_32(peer->mtu);
        verifyCommand.verifyConnect.windowSize                  = ENET_HOST_TO_NET_32(windowSize);
        verifyCommand.verifyConnect.channelCount                = ENET_HOST_TO_NET_32(channelCount);
        verifyCommand.verifyConnect.incomingBandwidth           = ENET_HOST_TO_NET_32(host->incomingBandwidth);
        verifyCommand.verifyConnect.outgoingBandwidth           = ENET_HOST_TO_NET_32(host->outgoingBandwidth);
        verifyCommand.verifyConnect.packetThrottleInterval      = ENET_HOST_TO_NET_32(peer->packetThrottleInterval);
        verifyCommand.verifyConnect.packetThrottleAcceleration  = ENET_HOST_TO_NET_32(peer->packetThrottleAcceleration);
        verifyCommand.verifyConnect.packetThrottleDeceleration  = ENET_HOST_TO_NET_32(peer->packetThrottleDeceleration);
        verifyCommand.verifyConnect.connectID                   = peer->connectID;

        enet_peer_queue_outgoing_command(peer, &verifyCommand, NULL, 0, 0);
        return peer;
    }